

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,void *src,size_t srcSize,
                 ZSTD_dictTableLoadMethod_e dtlm)

{
  int iVar1;
  ZSTD_matchState_t *ms_00;
  ulong in_RCX;
  ZSTD_compressionParameters *cParams_00;
  void *in_RDX;
  long in_RSI;
  ZSTD_window_t *in_RDI;
  ZSTD_matchState_t *unaff_retaddr;
  ZSTD_compressionParameters *in_stack_00000008;
  ZSTD_compressionParameters *cParams;
  BYTE *iend;
  BYTE *ip;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  ZSTD_compressionParameters *in_stack_fffffffffffffff8;
  
  iVar1 = (int)in_RDX + (int)in_RCX;
  ms_00 = (ZSTD_matchState_t *)(in_RSI + 4);
  ZSTD_window_update(in_RDI,in_RDX,in_RCX);
  if (*(int *)(in_RSI + 0x34) == 0) {
    iVar2 = iVar1 - (int)in_RDI->base;
  }
  else {
    iVar2 = 0;
  }
  *(int *)&in_RDI[1].nextSrc = iVar2;
  if (8 < in_RCX) {
    cParams_00 = (ZSTD_compressionParameters *)(ulong)(*(int *)(in_RSI + 0x1c) - 1);
    switch(cParams_00) {
    case (ZSTD_compressionParameters *)0x0:
      ZSTD_fillHashTable(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                         (ZSTD_dictTableLoadMethod_e)((ulong)in_RSI >> 0x20));
      break;
    case (ZSTD_compressionParameters *)0x1:
      ZSTD_fillDoubleHashTable
                ((ZSTD_matchState_t *)cParams,in_stack_00000008,unaff_retaddr,
                 (ZSTD_dictTableLoadMethod_e)((ulong)in_stack_fffffffffffffff8 >> 0x20));
      break;
    case (ZSTD_compressionParameters *)0x2:
    case (ZSTD_compressionParameters *)0x3:
    case (ZSTD_compressionParameters *)0x4:
      if (7 < in_RCX) {
        ZSTD_insertAndFindFirstIndex
                  ((ZSTD_matchState_t *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),cParams_00,
                   (BYTE *)0x1fd673);
      }
      break;
    case (ZSTD_compressionParameters *)0x5:
    case (ZSTD_compressionParameters *)0x6:
    case (ZSTD_compressionParameters *)0x7:
      if (7 < in_RCX) {
        ZSTD_updateTree(ms_00,(ZSTD_compressionParameters *)
                              CONCAT44(iVar2,in_stack_ffffffffffffffb0),(BYTE *)cParams_00,
                        (BYTE *)0x1fd69a);
      }
    }
    *(int *)((long)&in_RDI[1].nextSrc + 4) = iVar1 - (int)in_RDI->base;
  }
  return 0;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* const ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    ZSTD_compressionParameters const* cParams = &params->cParams;

    ZSTD_window_update(&ms->window, src, srcSize);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);

    if (srcSize <= HASH_READ_SIZE) return 0;

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, cParams, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, cParams, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_insertAndFindFirstIndex(ms, cParams, iend-HASH_READ_SIZE);
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_updateTree(ms, cParams, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}